

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O1

ssize_t __thiscall io_buf::fill(io_buf *this,int f)

{
  char **ppcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  int extraout_var;
  ssize_t sVar6;
  
  pcVar2 = (this->space).end_array;
  if (pcVar2 == (this->space)._end) {
    pcVar3 = (this->space)._begin;
    pcVar4 = this->head;
    v_array<char>::resize(&this->space,((long)pcVar2 - (long)pcVar3) * 2);
    this->head = pcVar4 + ((long)(this->space)._begin - (long)pcVar3);
  }
  pcVar2 = (this->space)._end;
  iVar5 = (*this->_vptr_io_buf[5])(this,f,pcVar2,(long)(this->space).end_array - (long)pcVar2);
  sVar6 = CONCAT44(extraout_var,iVar5);
  if (extraout_var < 0) {
    sVar6 = 0;
  }
  else {
    ppcVar1 = &(this->space)._end;
    *ppcVar1 = *ppcVar1 + sVar6;
  }
  return sVar6;
}

Assistant:

ssize_t fill(int f)
  {  // if the loaded values have reached the allocated space
    if (space.end_array - space.end() == 0)
    {  // reallocate to twice as much space
      size_t head_loc = head - space.begin();
      space.resize(2 * (space.end_array - space.begin()));
      head = space.begin() + head_loc;
    }
    // read more bytes from file up to the remaining allocated space
    ssize_t num_read = read_file(f, space.end(), space.end_array - space.end());
    if (num_read >= 0)
    {  // if some bytes were actually loaded, update the end of loaded values
      space.end() = space.end() + num_read;
      return num_read;
    }
    else
      return 0;
  }